

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O1

void rsg::ValueRange::computeIntersection
               (ValueRangeAccess dst,ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Type TVar7;
  int iVar8;
  VariableType *pVVar9;
  ValueRangeAccess dst_00;
  ValueRangeAccess dst_01;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ConstValueRangeAccess local_b8;
  ConstValueRangeAccess local_a0;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  VariableType *local_60;
  Scalar *pSStack_58;
  Scalar *local_50;
  undefined8 local_48;
  Scalar *pSStack_40;
  Scalar *local_38;
  
  pVVar9 = a->m_type;
  TVar7 = pVVar9->m_baseType;
  if (TVar7 == TYPE_ARRAY) {
    iVar10 = pVVar9->m_numElements;
    if (0 < iVar10) {
      iVar12 = 0;
      do {
        iVar11 = VariableType::getElementScalarOffset(dst.super_ConstValueRangeAccess.m_type,iVar12)
        ;
        local_60 = VariableType::getElementType(dst.super_ConstValueRangeAccess.m_type);
        pSStack_58 = dst.super_ConstValueRangeAccess.m_min + iVar11;
        local_50 = dst.super_ConstValueRangeAccess.m_max + iVar11;
        iVar11 = VariableType::getElementScalarOffset(a->m_type,iVar12);
        local_a0.m_type = VariableType::getElementType(a->m_type);
        local_a0.m_min = a->m_min + iVar11;
        local_a0.m_max = a->m_max + iVar11;
        iVar11 = VariableType::getElementScalarOffset(b->m_type,iVar12);
        local_b8.m_type = VariableType::getElementType(b->m_type);
        local_b8.m_min = b->m_min + iVar11;
        local_b8.m_max = b->m_max + iVar11;
        dst_01.super_ConstValueRangeAccess.m_min = pSStack_58;
        dst_01.super_ConstValueRangeAccess.m_type = local_60;
        dst_01.super_ConstValueRangeAccess.m_max = local_50;
        computeIntersection(dst_01,&local_a0,&local_b8);
        iVar12 = iVar12 + 1;
      } while (iVar10 != iVar12);
    }
  }
  else if (TVar7 == TYPE_STRUCT) {
    uVar14 = (int)((long)(pVVar9->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pVVar9->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
    if (0 < (int)uVar14) {
      lVar16 = 0;
      uVar13 = 0;
      do {
        iVar12 = (int)uVar13;
        iVar10 = VariableType::getMemberScalarOffset(dst.super_ConstValueRangeAccess.m_type,iVar12);
        local_48 = *(undefined8 *)
                    ((long)&(((dst.super_ConstValueRangeAccess.m_type)->m_members).
                             super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar16);
        pSStack_40 = dst.super_ConstValueRangeAccess.m_min + iVar10;
        local_38 = dst.super_ConstValueRangeAccess.m_max + iVar10;
        iVar10 = VariableType::getMemberScalarOffset(a->m_type,iVar12);
        local_a0.m_type =
             *(VariableType **)
              ((long)&((a->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar16);
        local_a0.m_min = a->m_min + iVar10;
        local_a0.m_max = a->m_max + iVar10;
        iVar10 = VariableType::getMemberScalarOffset(b->m_type,iVar12);
        local_b8.m_min = b->m_min + iVar10;
        local_b8.m_max = b->m_max + iVar10;
        local_b8.m_type =
             *(VariableType **)
              ((long)&((b->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar16);
        dst_00.super_ConstValueRangeAccess.m_min = pSStack_40;
        dst_00.super_ConstValueRangeAccess.m_type = (VariableType *)local_48;
        dst_00.super_ConstValueRangeAccess.m_max = local_38;
        computeIntersection(dst_00,&local_a0,&local_b8);
        uVar13 = uVar13 + 1;
        lVar16 = lVar16 + 0x28;
      } while ((uVar14 & 0x7fffffff) != uVar13);
    }
  }
  else if (TVar7 - TYPE_FLOAT < 7) {
    uVar14 = pVVar9->m_numElements;
    uVar13 = (ulong)uVar14;
    switch(TVar7) {
    case TYPE_FLOAT:
      if (0 < (int)uVar14) {
        uVar15 = 0;
        do {
          VariableType::getElementType(a->m_type);
          fVar1 = a->m_min[uVar15].floatVal;
          VariableType::getElementType(a->m_type);
          fVar2 = a->m_max[uVar15].floatVal;
          VariableType::getElementType(b->m_type);
          local_88 = ZEXT416((uint)b->m_min[uVar15].intVal);
          VariableType::getElementType(b->m_type);
          local_78 = ZEXT416((uint)b->m_max[uVar15].intVal);
          uVar14 = -(uint)((float)local_88._0_4_ <= fVar1);
          uVar17 = ~uVar14 & local_88._0_4_;
          VariableType::getElementType(dst.super_ConstValueRangeAccess.m_type);
          dst.super_ConstValueRangeAccess.m_min[uVar15].intVal = uVar17 | (uint)fVar1 & uVar14;
          uVar14 = -(uint)(fVar2 <= (float)local_78._0_4_);
          uVar17 = ~uVar14 & local_78._0_4_;
          VariableType::getElementType(dst.super_ConstValueRangeAccess.m_type);
          dst.super_ConstValueRangeAccess.m_max[uVar15].intVal = uVar17 | (uint)fVar2 & uVar14;
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      break;
    default:
      if (0 < (int)uVar14) {
        local_78._0_8_ = dst.super_ConstValueRangeAccess.m_min;
        local_88._0_8_ = dst.super_ConstValueRangeAccess.m_max;
        uVar15 = 0;
        do {
          VariableType::getElementType(a->m_type);
          iVar10 = a->m_min[uVar15].intVal;
          VariableType::getElementType(a->m_type);
          iVar12 = a->m_max[uVar15].intVal;
          VariableType::getElementType(b->m_type);
          iVar11 = b->m_min[uVar15].intVal;
          VariableType::getElementType(b->m_type);
          iVar8 = b->m_max[uVar15].intVal;
          if (iVar11 < iVar10) {
            iVar11 = iVar10;
          }
          VariableType::getElementType(dst.super_ConstValueRangeAccess.m_type);
          *(int *)(local_78._0_8_ + uVar15 * 4) = iVar11;
          if (iVar12 < iVar8) {
            iVar8 = iVar12;
          }
          VariableType::getElementType(dst.super_ConstValueRangeAccess.m_type);
          *(int *)(local_88._0_8_ + uVar15 * 4) = iVar8;
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      break;
    case TYPE_BOOL:
      if (0 < (int)uVar14) {
        uVar15 = 0;
        do {
          VariableType::getElementType(a->m_type);
          bVar3 = a->m_min[uVar15].boolVal;
          VariableType::getElementType(a->m_type);
          bVar4 = a->m_max[uVar15].boolVal;
          VariableType::getElementType(b->m_type);
          bVar5 = b->m_min[uVar15].boolVal;
          VariableType::getElementType(b->m_type);
          bVar6 = b->m_max[uVar15].boolVal;
          VariableType::getElementType(dst.super_ConstValueRangeAccess.m_type);
          dst.super_ConstValueRangeAccess.m_min[uVar15].boolVal = (bool)(bVar3 | bVar5);
          VariableType::getElementType(dst.super_ConstValueRangeAccess.m_type);
          dst.super_ConstValueRangeAccess.m_max[uVar15].boolVal = (bool)(bVar4 & bVar6);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      break;
    case TYPE_STRUCT:
    case TYPE_ARRAY:
      break;
    }
  }
  return;
}

Assistant:

void ValueRange::computeIntersection (ValueRangeAccess dst, const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(dst.getType() == a.getType() && dst.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
			computeIntersection(dst.member(ndx), a.member(ndx), b.member(ndx));
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
			computeIntersection(dst.arrayElement(ndx), a.arrayElement(ndx), b.arrayElement(ndx));
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					dst.component(ndx).getMin() = de::max(aMin, bMin);
					dst.component(ndx).getMax() = de::min(aMax, bMax);
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					dst.component(ndx).getMin() = de::max(aMin, bMin);
					dst.component(ndx).getMax() = de::min(aMax, bMax);
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					dst.component(ndx).getMin() = aMin || bMin;
					dst.component(ndx).getMax() = aMax && bMax;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}